

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetArrayOfNonStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GenReceiver(this,struct_def,code_ptr);
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_d0,pIVar1,field);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::append((char *)code_ptr);
  GenIndents_abi_cxx11_((string *)local_b0,this,2);
  std::operator+(&local_d0,(string *)local_b0,"if j is None:");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  GenIndents_abi_cxx11_(&local_70,this,3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_70,"return [");
  GenGetter_abi_cxx11_(&local_90,this,&(field->value).type);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_90);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)code_ptr);
  NumToString<unsigned_short>((string *)local_b0,(field->value).offset);
  std::operator+(&local_d0,(string *)local_b0," + i * ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  local_b0._0_4_ = (field->value).type.element;
  local_b0._24_2_ = (field->value).type.fixed_length;
  local_b0._4_4_ = BASE_TYPE_NONE;
  local_b0._8_8_ = (field->value).type.struct_def;
  local_b0._16_8_ = (field->value).type.enum_def;
  sVar2 = InlineSize((Type *)local_b0);
  NumToString<unsigned_long>(&local_d0,sVar2);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::append((char *)code_ptr);
  (*(pIVar1->super_Namer)._vptr_Namer[4])(&local_90,pIVar1,field);
  std::operator+(&local_70,"self.",&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_70,"Length()");
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,")]")
  ;
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  GenIndents_abi_cxx11_(&local_90,this,2);
  std::operator+(&local_70,&local_90,"elif j >= 0 and j < self.");
  (*(pIVar1->super_Namer)._vptr_Namer[4])(&local_50,pIVar1,field);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_70,&local_50);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "Length():");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  GenIndents_abi_cxx11_(&local_70,this,3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_70,"return ");
  GenGetter_abi_cxx11_(&local_90,this,&(field->value).type);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_90);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)code_ptr);
  NumToString<unsigned_short>((string *)local_b0,(field->value).offset);
  std::operator+(&local_d0,(string *)local_b0," + j * ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  local_b0._0_4_ = (field->value).type.element;
  local_b0._24_2_ = (field->value).type.fixed_length;
  local_b0._4_4_ = BASE_TYPE_NONE;
  local_b0._8_8_ = (field->value).type.struct_def;
  local_b0._16_8_ = (field->value).type.enum_def;
  sVar2 = InlineSize((Type *)local_b0);
  NumToString<unsigned_long>(&local_d0,sVar2);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::append((char *)code_ptr);
  GenIndents_abi_cxx11_((string *)local_b0,this,2);
  std::operator+(&local_d0,(string *)local_b0,"else:");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  GenIndents_abi_cxx11_((string *)local_b0,this,3);
  std::operator+(&local_d0,(string *)local_b0,"return None\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void GetArrayOfNonStruct(const StructDef &struct_def, const FieldDef &field,
                           std::string *code_ptr) const {
    auto &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    code += "(self, j = None):";
    code += GenIndents(2) + "if j is None:";
    code += GenIndents(3) + "return [" + GenGetter(field.value.type);
    code += "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(";
    code += NumToString(field.value.offset) + " + i * ";
    code += NumToString(InlineSize(field.value.type.VectorType()));
    code += ")) for i in range(";
    code += "self." + namer_.Method(field) + "Length()" + ")]";
    code += GenIndents(2) + "elif j >= 0 and j < self." + namer_.Method(field) +
            "Length():";
    code += GenIndents(3) + "return " + GenGetter(field.value.type);
    code += "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(";
    code += NumToString(field.value.offset) + " + j * ";
    code += NumToString(InlineSize(field.value.type.VectorType()));
    code += "))";
    code += GenIndents(2) + "else:";
    code += GenIndents(3) + "return None\n\n";
  }